

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

int luaO_int2fb(uint x)

{
  undefined4 local_14;
  undefined4 local_10;
  int e;
  uint x_local;
  
  local_14 = 0;
  for (local_10 = x; 0xf < local_10; local_10 = local_10 + 1 >> 1) {
    local_14 = local_14 + 1;
  }
  if (local_10 < 8) {
    e = local_10;
  }
  else {
    e = (local_14 + 1) * 8 | local_10 - 8;
  }
  return e;
}

Assistant:

int luaO_int2fb (unsigned int x) {
  int e = 0;  /* expoent */
  while (x >= 16) {
    x = (x+1) >> 1;
    e++;
  }
  if (x < 8) return x;
  else return ((e+1) << 3) | (cast_int(x) - 8);
}